

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

mcu8str * mcplcfg_shlibpath(nccfgstate *state)

{
  long in_RSI;
  mcu8str *in_RDI;
  nccfgstate *unaff_retaddr;
  mcu8str shlibdir;
  mcu8str *str;
  mcu8str *in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RSI + 0x20) == 0) {
    str = in_RDI;
    mcplcfg_init_bindir(unaff_retaddr);
    mcplcfg_const_bin2shlibdir();
    mcplcfg_resolverelpath((mcu8str *)shlibdir._8_8_,shlibdir.c_str);
    mcplcfg_shlibpath_given_shlibdir(in_stack_fffffffffffffff0);
    mcu8str_dealloc(str);
  }
  else {
    mcplcfg_shlibpath_given_shlibdir(in_stack_fffffffffffffff0);
  }
  return in_RDI;
}

Assistant:

mcu8str mcplcfg_shlibpath( nccfgstate* state )
{
  if ( state->shlibdir_override.size > 0 ) {
    return mcplcfg_shlibpath_given_shlibdir( &(state->shlibdir_override) );
  } else {
    mcplcfg_init_bindir(state);
    mcu8str shlibdir = mcplcfg_resolverelpath(&(state->bindir),
                                            mcplcfg_const_bin2shlibdir());
    mcu8str res = mcplcfg_shlibpath_given_shlibdir( &shlibdir );
    mcu8str_dealloc( &shlibdir );
    return res;
  }
}